

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniGUI.c
# Opt level: O0

void EPD_DrawPolygon(pPoint Points,uint16_t PointCount,uint8_t color)

{
  uint16_t local_12;
  uint16_t y;
  uint16_t x;
  uint8_t color_local;
  uint16_t PointCount_local;
  pPoint Points_local;
  
  if (1 < PointCount) {
    EPD_DrawLine(Points->X,Points->Y,Points[(long)(int)(uint)PointCount + -1].X,
                 Points[(long)(int)(uint)PointCount + -1].Y,color);
    local_12 = PointCount;
    _y = Points;
    while (local_12 = local_12 - 1, local_12 != 0) {
      EPD_DrawLine(_y->X,_y->Y,_y[1].X,_y[1].Y,color);
      _y = _y + 1;
    }
  }
  return;
}

Assistant:

void EPD_DrawPolygon(pPoint Points,uint16_t PointCount,uint8_t color)
{
  uint16_t x = 0, y = 0;
  
  if(PointCount < 2)
  {
    return;
  }
  
  EPD_DrawLine(Points->X, Points->Y, (Points+PointCount-1)->X, (Points+PointCount-1)->Y,color);
  
  while(--PointCount)
  {
    x = Points->X;
    y = Points->Y;
    Points++;
    EPD_DrawLine(x, y, Points->X, Points->Y,color);
  }
}